

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetSpecsOf.hpp
# Opt level: O3

void __thiscall sciplot::OffsetSpecs::~OffsetSpecs(OffsetSpecs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&this->super_OffsetSpecsOf<sciplot::OffsetSpecs> = &PTR__OffsetSpecsOf_001a6908;
  pcVar2 = (this->super_OffsetSpecsOf<sciplot::OffsetSpecs>).yoffset._M_dataplus._M_p;
  paVar1 = &(this->super_OffsetSpecsOf<sciplot::OffsetSpecs>).yoffset.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_OffsetSpecsOf<sciplot::OffsetSpecs>).xoffset._M_dataplus._M_p;
  paVar1 = &(this->super_OffsetSpecsOf<sciplot::OffsetSpecs>).xoffset.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

OffsetSpecsOf<DerivedSpecs>::OffsetSpecsOf()
{
}